

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDynamicRowMatrix.cpp
# Opt level: O2

void __thiscall HighsDynamicRowMatrix::unlinkColumns(HighsDynamicRowMatrix *this,HighsInt rowindex)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  pointer ppVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer piVar12;
  HighsInt i;
  long lVar13;
  int iVar14;
  int iVar15;
  pointer piVar16;
  
  puVar3 = (this->colsLinked).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar3[rowindex] != '\0') {
    puVar3[rowindex] = '\0';
    ppVar4 = (this->ARrange_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = ppVar4[rowindex].second;
    pdVar6 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->AprevNeg_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->AnextNeg_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->AheadNeg_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->AprevPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->AnextPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar12 = (this->AheadPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar13 = (long)ppVar4[rowindex].first; iVar1 != lVar13; lVar13 = lVar13 + 1) {
      iVar2 = piVar5[lVar13];
      if (pdVar6[lVar13] <= 0.0) {
        iVar14 = piVar7[lVar13];
        iVar15 = piVar8[lVar13];
        if ((long)iVar15 != -1) {
          piVar7[iVar15] = iVar14;
        }
        piVar16 = piVar8;
        if (iVar14 == -1) {
          piVar16 = piVar9;
          iVar14 = iVar2;
        }
      }
      else {
        iVar14 = piVar10[lVar13];
        iVar15 = piVar11[lVar13];
        if ((long)iVar15 != -1) {
          piVar10[iVar15] = iVar14;
        }
        piVar16 = piVar11;
        if (iVar14 == -1) {
          piVar16 = piVar12;
          iVar14 = iVar2;
        }
      }
      piVar16[iVar14] = iVar15;
    }
  }
  return;
}

Assistant:

void HighsDynamicRowMatrix::unlinkColumns(HighsInt rowindex) {
  if (!colsLinked[rowindex]) return;

  colsLinked[rowindex] = false;
  HighsInt start = ARrange_[rowindex].first;
  HighsInt end = ARrange_[rowindex].second;
  for (HighsInt i = start; i != end; ++i) {
    HighsInt col = ARindex_[i];

    if (ARvalue_[i] > 0) {
      HighsInt prev = AprevPos_[i];
      HighsInt next = AnextPos_[i];

      if (next != -1) {
        assert(AprevPos_[next] == i);
        AprevPos_[next] = prev;
      }

      if (prev != -1) {
        assert(AnextPos_[prev] == i);
        AnextPos_[prev] = next;
      } else {
        assert(AheadPos_[col] == i);
        AheadPos_[col] = next;
      }
    } else {
      HighsInt prev = AprevNeg_[i];
      HighsInt next = AnextNeg_[i];

      if (next != -1) {
        assert(AprevNeg_[next] == i);
        AprevNeg_[next] = prev;
      }

      if (prev != -1) {
        assert(AnextNeg_[prev] == i);
        AnextNeg_[prev] = next;
      } else {
        assert(AheadNeg_[col] == i);
        AheadNeg_[col] = next;
      }
    }
  }
}